

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int m_get_block(aec_stream *strm)

{
  internal_state *piVar1;
  code *pcVar2;
  internal_state *state;
  
  piVar1 = strm->state;
  if (strm->avail_out < 0x103) {
    if ((piVar1->zero_blocks == 0) || (piVar1->direct_out != 0)) {
      piVar1->cds_buf[0] = *piVar1->cds;
      piVar1->cds = piVar1->cds_buf;
    }
    piVar1->direct_out = 0;
  }
  else if (piVar1->direct_out == 0) {
    piVar1->direct_out = 1;
    *strm->next_out = *piVar1->cds;
    piVar1->cds = strm->next_out;
  }
  if (piVar1->block_nonzero == 0) {
    if (piVar1->blocks_avail == 0) {
      piVar1->blocks_avail = strm->rsi - 1;
      piVar1->block = piVar1->data_pp;
      piVar1->blocks_dispensed = 1;
      if (strm->avail_in < (ulong)piVar1->rsi_len) {
        piVar1->i = 0;
        pcVar2 = m_get_rsi_resumable;
        goto LAB_00101693;
      }
      (*piVar1->get_rsi)(strm);
      if ((strm->flags & 8) != 0) {
        (*piVar1->preprocess)(strm);
      }
    }
    else {
      if (piVar1->ref != 0) {
        piVar1->ref = 0;
        piVar1->uncomp_len = strm->bits_per_sample * strm->block_size;
      }
      piVar1->block = piVar1->block + strm->block_size;
      piVar1->blocks_dispensed = piVar1->blocks_dispensed + 1;
      piVar1->blocks_avail = piVar1->blocks_avail + -1;
    }
    m_check_zero_block(strm);
  }
  else {
    piVar1->block_nonzero = 0;
    pcVar2 = m_select_code_option;
LAB_00101693:
    piVar1->mode = pcVar2;
  }
  return 1;
}

Assistant:

static int m_get_block(struct aec_stream *strm)
{
    /**
       Provide the next block of preprocessed input data.

       Pull in a whole Reference Sample Interval (RSI) of data if
       block buffer is empty.
    */

    struct internal_state *state = strm->state;

    init_output(strm);

    if (state->block_nonzero) {
        state->block_nonzero = 0;
        state->mode = m_select_code_option;
        return M_CONTINUE;
    }

    if (state->blocks_avail == 0) {
        state->blocks_avail = strm->rsi - 1;
        state->block = state->data_pp;
        state->blocks_dispensed = 1;

        if (strm->avail_in >= state->rsi_len) {
            state->get_rsi(strm);
            if (strm->flags & AEC_DATA_PREPROCESS)
                state->preprocess(strm);

            return m_check_zero_block(strm);
        } else {
            state->i = 0;
            state->mode = m_get_rsi_resumable;
        }
    } else {
        if (state->ref) {
            state->ref = 0;
            state->uncomp_len = strm->block_size * strm->bits_per_sample;
        }
        state->block += strm->block_size;
        state->blocks_dispensed++;
        state->blocks_avail--;
        return m_check_zero_block(strm);
    }
    return M_CONTINUE;
}